

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32_pclmulqdq_tpl.h
# Opt level: O0

void fold_3(__m128i *xmm_crc0,__m128i *xmm_crc1,__m128i *xmm_crc2,__m128i *xmm_crc3)

{
  undefined1 auVar1 [16];
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  undefined1 (*in_RCX) [16];
  undefined1 (*in_RDX) [16];
  undefined1 (*in_RSI) [16];
  undefined1 (*in_RDI) [16];
  __m128i xmm_fold4;
  ulong local_118;
  ulong uStack_110;
  __m128 ps_res10;
  __m128 ps_res21;
  __m128 ps_res32;
  __m128 ps_crc3;
  __m128 ps_crc2;
  __m128 ps_crc1;
  __m128 ps_crc0;
  __m128i x_tmp3;
  
  auVar1 = vpinsrd_avx(ZEXT416(0xc6e41596),1,1);
  auVar1 = vpinsrd_avx(auVar1,0x54442bd4,2);
  auVar1 = vpinsrd_avx(auVar1,1,3);
  local_118 = auVar1._0_8_;
  uStack_110 = auVar1._8_8_;
  uVar15 = *(undefined8 *)*in_RCX;
  uVar16 = *(undefined8 *)(*in_RCX + 8);
  uVar17 = *(undefined8 *)(*in_RDX + 8);
  *(undefined8 *)*in_RCX = *(undefined8 *)*in_RDX;
  *(undefined8 *)(*in_RCX + 8) = uVar17;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(*in_RDX + 8);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_118;
  auVar1 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar3 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar1 = auVar1 ^ auVar6 << uVar2;
    }
  }
  *in_RDX = auVar1;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)*in_RCX;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uStack_110;
  auVar1 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar9 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar1 = auVar1 ^ auVar12 << uVar2;
    }
  }
  *in_RCX = auVar1;
  uVar18 = *(ulong *)*in_RDX;
  uVar19 = *(ulong *)(*in_RDX + 8);
  uVar20 = *(ulong *)*in_RCX;
  uVar21 = *(ulong *)(*in_RCX + 8);
  uVar17 = *(undefined8 *)(*in_RSI + 8);
  *(undefined8 *)*in_RDX = *(undefined8 *)*in_RSI;
  *(undefined8 *)(*in_RDX + 8) = uVar17;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(*in_RSI + 8);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_118;
  auVar1 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar4 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar1 = auVar1 ^ auVar7 << uVar2;
    }
  }
  *in_RSI = auVar1;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)*in_RDX;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uStack_110;
  auVar1 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar10 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar1 = auVar1 ^ auVar13 << uVar2;
    }
  }
  *in_RDX = auVar1;
  uVar22 = *(ulong *)*in_RSI;
  uVar23 = *(ulong *)(*in_RSI + 8);
  uVar24 = *(ulong *)*in_RDX;
  uVar25 = *(ulong *)(*in_RDX + 8);
  uVar17 = *(undefined8 *)(*in_RDI + 8);
  *(undefined8 *)*in_RSI = *(undefined8 *)*in_RDI;
  *(undefined8 *)(*in_RSI + 8) = uVar17;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(*in_RDI + 8);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_118;
  auVar1 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar5 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar1 = auVar1 ^ auVar8 << uVar2;
    }
  }
  *in_RDI = auVar1;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)*in_RSI;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uStack_110;
  auVar1 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar11 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar1 = auVar1 ^ auVar14 << uVar2;
    }
  }
  *in_RSI = auVar1;
  uVar26 = *(ulong *)*in_RDI;
  uVar27 = *(ulong *)(*in_RDI + 8);
  uVar28 = *(ulong *)*in_RSI;
  uVar29 = *(ulong *)(*in_RSI + 8);
  *(undefined8 *)*in_RDI = uVar15;
  *(undefined8 *)(*in_RDI + 8) = uVar16;
  *(ulong *)*in_RSI = uVar26 ^ uVar28;
  *(ulong *)(*in_RSI + 8) = uVar27 ^ uVar29;
  *(ulong *)*in_RDX = uVar22 ^ uVar24;
  *(ulong *)(*in_RDX + 8) = uVar23 ^ uVar25;
  *(ulong *)*in_RCX = uVar18 ^ uVar20;
  *(ulong *)(*in_RCX + 8) = uVar19 ^ uVar21;
  return;
}

Assistant:

static void fold_3(__m128i *xmm_crc0, __m128i *xmm_crc1, __m128i *xmm_crc2, __m128i *xmm_crc3) {
    const __m128i xmm_fold4 = _mm_set_epi32( 0x00000001, 0x54442bd4,
                                             0x00000001, 0xc6e41596);
    __m128i x_tmp3;
    __m128 ps_crc0, ps_crc1, ps_crc2, ps_crc3, ps_res32, ps_res21, ps_res10;

    x_tmp3 = *xmm_crc3;

    *xmm_crc3 = *xmm_crc2;
    *xmm_crc2 = _mm_clmulepi64_si128(*xmm_crc2, xmm_fold4, 0x01);
    *xmm_crc3 = _mm_clmulepi64_si128(*xmm_crc3, xmm_fold4, 0x10);
    ps_crc2 = _mm_castsi128_ps(*xmm_crc2);
    ps_crc3 = _mm_castsi128_ps(*xmm_crc3);
    ps_res32 = _mm_xor_ps(ps_crc2, ps_crc3);

    *xmm_crc2 = *xmm_crc1;
    *xmm_crc1 = _mm_clmulepi64_si128(*xmm_crc1, xmm_fold4, 0x01);
    *xmm_crc2 = _mm_clmulepi64_si128(*xmm_crc2, xmm_fold4, 0x10);
    ps_crc1 = _mm_castsi128_ps(*xmm_crc1);
    ps_crc2 = _mm_castsi128_ps(*xmm_crc2);
    ps_res21 = _mm_xor_ps(ps_crc1, ps_crc2);

    *xmm_crc1 = *xmm_crc0;
    *xmm_crc0 = _mm_clmulepi64_si128(*xmm_crc0, xmm_fold4, 0x01);
    *xmm_crc1 = _mm_clmulepi64_si128(*xmm_crc1, xmm_fold4, 0x10);
    ps_crc0 = _mm_castsi128_ps(*xmm_crc0);
    ps_crc1 = _mm_castsi128_ps(*xmm_crc1);
    ps_res10 = _mm_xor_ps(ps_crc0, ps_crc1);

    *xmm_crc0 = x_tmp3;
    *xmm_crc1 = _mm_castps_si128(ps_res10);
    *xmm_crc2 = _mm_castps_si128(ps_res21);
    *xmm_crc3 = _mm_castps_si128(ps_res32);
}